

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

shared_ptr<const_SyntaxTree> hint_from(optional<const_SyntaxTree_&> *cmdnode,value_type *arg)

{
  bool bVar1;
  SyntaxTree **ppSVar2;
  variant<const_SyntaxTree_*,_int,_float> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_SyntaxTree> sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  bVar1 = is<SyntaxTree_const*,eggs::variants::variant<SyntaxTree_const*,int,float>>(in_RDX);
  if (bVar1) {
    ppSVar2 = eggs::variants::get<SyntaxTree_const*,SyntaxTree_const*,int,float,0ul>(in_RDX);
    std::__shared_ptr<SyntaxTree_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
              ((__shared_ptr<SyntaxTree_const,(__gnu_cxx::_Lock_policy)2> *)cmdnode,
               (__weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *)*ppSVar2);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    sVar4 = hint_from(cmdnode);
    _Var3 = sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)cmdnode;
  return (shared_ptr<const_SyntaxTree>)
         sVar4.super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto hint_from(optional<const SyntaxTree&> cmdnode, const Commands::MatchArgumentList::value_type& arg) -> shared_ptr<const SyntaxTree>
{
    if(is<const SyntaxTree*>(arg))
        return get<const SyntaxTree*>(arg)->shared_from_this();
    return hint_from(cmdnode);
}